

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O0

void Js::ProfilingHelpers::ProfiledStElem_FastPath
               (JavascriptArray *array,Var varIndex,Var value,ScriptContext *scriptContext,
               PropertyOperationFlags flags,StElemInfo *stElemInfo)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  SparseArraySegmentBase *pSVar6;
  uint32 index2;
  SparseArraySegment<void_*> *lastUsedSeg;
  uint32 offset;
  SparseArraySegmentBase *head;
  int32 index;
  StElemInfo *stElemInfo_local;
  PropertyOperationFlags flags_local;
  ScriptContext *scriptContext_local;
  Var value_local;
  Var varIndex_local;
  JavascriptArray *array_local;
  
  if (array == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x196,"(array)","array");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (varIndex == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x197,"(varIndex)","varIndex");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x198,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x199,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = Js::JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x19a,
                                "(!JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext))"
                                ,
                                "!JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(varIndex);
  if ((bVar2) && (uVar3 = TaggedInt::ToInt32(varIndex), -1 < (int)uVar3)) {
    if (stElemInfo != (StElemInfo *)0x0) {
      pSVar6 = Js::JavascriptArray::GetHead(array);
      if (pSVar6->left != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                    ,0x1ad,"(head->left == 0)","head->left == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (pSVar6->length <= uVar3) {
        (stElemInfo->field_2).bits = (stElemInfo->field_2).bits & 0xef | 0x10;
        uVar4 = ArrayObject::GetLength(&array->super_ArrayObject);
        if (uVar4 <= uVar3) {
          (stElemInfo->field_2).bits = (stElemInfo->field_2).bits & 0xdf | 0x20;
        }
      }
      if (uVar3 < pSVar6->size) {
        Js::JavascriptArray::DirectProfiledSetItemInHeadSegmentAt<void*>
                  (array,uVar3,value,stElemInfo);
        return;
      }
    }
    pSVar6 = Js::JavascriptArray::GetLastUsedSegment(array);
    if (((pSVar6 != (SparseArraySegmentBase *)0x0) && (pSVar6->left <= uVar3)) &&
       (uVar3 = uVar3 - pSVar6->left, uVar3 < pSVar6->size)) {
      Js::JavascriptArray::DirectSetItemInLastUsedSegmentAt<void*>(array,uVar3,value);
      return;
    }
  }
  if (stElemInfo != (StElemInfo *)0x0) {
    (stElemInfo->field_2).bits = (stElemInfo->field_2).bits & 0xf7 | 8;
  }
  Js::JavascriptOperators::OP_SetElementI(array,varIndex,value,scriptContext,flags);
  return;
}

Assistant:

void ProfilingHelpers::ProfiledStElem_FastPath(
        JavascriptArray *const array,
        const Var varIndex,
        const Var value,
        ScriptContext *const scriptContext,
        const PropertyOperationFlags flags,
        StElemInfo *const stElemInfo)
    {
        Assert(array);
        Assert(varIndex);
        Assert(value);
        Assert(scriptContext);
        Assert(!JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext));

        do // while(false)
        {
            if (!TaggedInt::Is(varIndex))
            {
                break;
            }

            int32 index = TaggedInt::ToInt32(varIndex);

            if (index < 0)
            {
                break;
            }

            if(stElemInfo)
            {
                SparseArraySegmentBase *const head = array->GetHead();
                Assert(head->left == 0);
                const uint32 offset = index;
                if(offset >= head->length)
                {
                    stElemInfo->storedOutsideHeadSegmentBounds = true;
                    if(offset >= array->GetLength())
                    {
                        stElemInfo->storedOutsideArrayBounds = true;
                    }
                }

                if(offset < head->size)
                {
                    array->DirectProfiledSetItemInHeadSegmentAt(offset, value, stElemInfo);
                    return;
                }
            }

            SparseArraySegment<Var>* lastUsedSeg = (SparseArraySegment<Var>*)array->GetLastUsedSegment();
            if (lastUsedSeg == NULL ||
                (uint32) index < lastUsedSeg->left)
            {
                break;
            }

            uint32 index2 = index - lastUsedSeg->left;

            if (index2 < lastUsedSeg->size)
            {
                // Successful fastpath
                array->DirectSetItemInLastUsedSegmentAt(index2, value);
                return;
            }
        } while(false);

        if(stElemInfo)
        {
            stElemInfo->neededHelperCall = true;
        }
        JavascriptOperators::OP_SetElementI(array, varIndex, value, scriptContext, flags);
    }